

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O0

void * __thiscall FResourceLump::CacheLump(FResourceLump *this)

{
  FResourceLump *this_local;
  
  if (this->Cache == (char *)0x0) {
    if (0 < this->LumpSize) {
      (*this->_vptr_FResourceLump[7])();
    }
  }
  else if ('\0' < this->RefCount) {
    this->RefCount = this->RefCount + '\x01';
  }
  return this->Cache;
}

Assistant:

void *FResourceLump::CacheLump()
{
	if (Cache != NULL)
	{
		if (RefCount > 0) RefCount++;
	}
	else if (LumpSize > 0)
	{
		FillCache();
	}
	return Cache;
}